

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NIVS.cpp
# Opt level: O0

void __thiscall
OpenMD::RNEMD::NIVSMethod::NIVSMethod(NIVSMethod *this,SimInfo *info,ForceManager *forceMan)

{
  allocator_type *paVar1;
  bool bVar2;
  Globals *this_00;
  undefined8 uVar3;
  reference pvVar4;
  SimInfo *in_RSI;
  RNEMD *in_RDI;
  RealType kineticFlux;
  vector<double,_std::allocator<double>_> momentumFluxVector;
  RealType momentumFlux;
  bool hasCorrectFlux;
  bool methodFluxMismatch;
  bool hasMomentumFlux;
  bool hasKineticFlux;
  RNEMDParameters *rnemdParams;
  ForceManager *in_stack_00001580;
  SimInfo *in_stack_00001588;
  RNEMD *in_stack_00001590;
  allocator_type *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  RNEMDFluxType RVar5;
  RNEMD *this_01;
  byte local_81;
  undefined1 local_59 [25];
  allocator_type *local_40;
  bool local_34;
  char local_33;
  byte local_32;
  byte local_31;
  RNEMDParameters *local_30;
  SimInfo *local_10;
  
  local_10 = in_RSI;
  RNEMD::RNEMD(in_stack_00001590,in_stack_00001588,in_stack_00001580);
  in_RDI->_vptr_RNEMD = (_func_int **)&PTR__NIVSMethod_0050a498;
  std::__cxx11::string::operator=((string *)&in_RDI->rnemdMethodLabel_,"NIVS");
  this_00 = SimInfo::getSimParams(local_10);
  local_30 = Globals::getRNEMDParameters(this_00);
  local_31 = RNEMDParameters::haveKineticFlux((RNEMDParameters *)0x330084);
  local_32 = RNEMDParameters::haveMomentumFlux((RNEMDParameters *)0x3300a4);
  local_33 = '\0';
  local_34 = false;
  RVar5 = in_RDI->rnemdFluxType_;
  if (RVar5 < rnemdPx) {
    bVar2 = (bool)(local_31 & 1);
  }
  else {
    bVar2 = (bool)local_32;
    if (2 < RVar5 - rnemdPx) {
      if (RVar5 - rnemdKePx < 2) {
        local_81 = 0;
        if ((bool)local_32) {
          local_81 = local_31;
        }
        bVar2 = (bool)(local_81 & 1);
      }
      else {
        local_33 = '\x01';
        bVar2 = local_34;
      }
    }
  }
  local_34 = bVar2;
  if (local_33 != '\0') {
    uVar3 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "RNEMD: The current method,\n\t\tNIVS\n\tcannot be used with the current flux type, %s\n"
             ,uVar3);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if ((local_34 & 1U) == 0) {
    uVar3 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "RNEMD: The current method, NIVS, and flux type, %s,\n\tdid not have the correct flux value specified. Options\n\tinclude: kineticFlux and momentumFlux.\n"
             ,uVar3);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if ((local_31 & 1) == 0) {
    RNEMD::setKineticFlux(in_RDI,0.0);
  }
  else {
    kineticFlux = RNEMDParameters::getKineticFlux((RNEMDParameters *)0x33023e);
    RNEMD::setKineticFlux(in_RDI,kineticFlux);
  }
  if ((local_32 & 1) != 0) {
    local_40 = (allocator_type *)RNEMDParameters::getMomentumFlux((RNEMDParameters *)0x330286);
    this_01 = (RNEMD *)local_59;
    std::allocator<double>::allocator((allocator<double> *)0x3302ac);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)this_01,
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40);
    std::allocator<double>::~allocator((allocator<double> *)0x3302cf);
    paVar1 = local_40;
    RVar5 = in_RDI->rnemdFluxType_;
    if (RVar5 == rnemdPx) {
      in_stack_ffffffffffffff40 = local_40;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_59 + 1),0);
      *pvVar4 = (value_type)in_stack_ffffffffffffff40;
    }
    else if (RVar5 == rnemdPy) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_59 + 1),1);
      *pvVar4 = (value_type)paVar1;
    }
    else if (RVar5 == rnemdPz) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_59 + 1),2);
      *pvVar4 = (value_type)paVar1;
    }
    RNEMD::setMomentumFluxVector
              (this_01,(vector<double,_std::allocator<double>_> *)
                       CONCAT44(RVar5,in_stack_ffffffffffffff48));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40);
  }
  return;
}

Assistant:

NIVSMethod::NIVSMethod(SimInfo* info, ForceManager* forceMan) :
      RNEMD {info, forceMan} {
    rnemdMethodLabel_ = "NIVS";

    RNEMDParameters* rnemdParams = info->getSimParams()->getRNEMDParameters();

    bool hasKineticFlux  = rnemdParams->haveKineticFlux();
    bool hasMomentumFlux = rnemdParams->haveMomentumFlux();

    bool methodFluxMismatch = false;
    bool hasCorrectFlux     = false;

    switch (rnemdFluxType_) {
    case rnemdKE:
    case rnemdRotKE:
    case rnemdFullKE:
      hasCorrectFlux = hasKineticFlux;
      break;
    case rnemdPx:
    case rnemdPy:
    case rnemdPz:
      hasCorrectFlux = hasMomentumFlux;
      break;
    case rnemdKePx:
    case rnemdKePy:
      hasCorrectFlux = hasMomentumFlux && hasKineticFlux;
      break;
    default:
      methodFluxMismatch = true;
      break;
    }

    if (methodFluxMismatch) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method,\n"
               "\t\tNIVS\n"
               "\tcannot be used with the current flux type, %s\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (!hasCorrectFlux) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method, NIVS, and flux type, %s,\n"
               "\tdid not have the correct flux value specified. Options\n"
               "\tinclude: kineticFlux and momentumFlux.\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (hasKineticFlux) {
      setKineticFlux(rnemdParams->getKineticFlux());
    } else {
      setKineticFlux(0.0);
    }

    if (hasMomentumFlux) {
      RealType momentumFlux = rnemdParams->getMomentumFlux();
      std::vector<RealType> momentumFluxVector(3);

      switch (rnemdFluxType_) {
      case rnemdPx:
        momentumFluxVector[0] = momentumFlux;
        break;
      case rnemdPy:
        momentumFluxVector[1] = momentumFlux;
        break;
      case rnemdPz:
        momentumFluxVector[2] = momentumFlux;
        break;
      default:
        break;
      }

      setMomentumFluxVector(momentumFluxVector);
    }
  }